

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_generator.cc
# Opt level: O0

t_generator *
t_generator_registry::get_generator
          (t_program *program,string *language,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *parsed_options,string *options)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  pointer ppVar4;
  undefined4 extraout_var;
  _Self local_48;
  _Self local_40;
  iterator iter;
  gen_map_t *the_map;
  string *options_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *parsed_options_local;
  string *language_local;
  t_program *program_local;
  
  iter._M_node = (_Base_ptr)get_generator_map_abi_cxx11_();
  local_40._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
       ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
               *)iter._M_node,language);
  bVar1 = std::operator==(language,"csharp");
  if ((bVar1) || (bVar1 = std::operator==(language,"netcore"), bVar1)) {
    uVar3 = std::__cxx11::string::c_str();
    failure("The \'%s\' target is no longer available. Use \'netstd\' instead.",uVar3);
  }
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>_>
       ::end(iter._M_node);
  bVar1 = std::operator==(&local_40,&local_48);
  if (bVar1) {
    program_local = (t_program *)0x0;
  }
  else {
    ppVar4 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_t_generator_factory_*>_>
             ::operator->(&local_40);
    iVar2 = (*ppVar4->second->_vptr_t_generator_factory[2])
                      (ppVar4->second,program,parsed_options,options);
    program_local = (t_program *)CONCAT44(extraout_var,iVar2);
  }
  return (t_generator *)program_local;
}

Assistant:

t_generator* t_generator_registry::get_generator(t_program* program,
                                                 const string& language,
                                                 const map<string, string>& parsed_options,
                                                 const std::string& options) {
  gen_map_t& the_map = get_generator_map();
  gen_map_t::iterator iter = the_map.find(language);

  if ((language == "csharp") || (language == "netcore")) {
    failure("The '%s' target is no longer available. Use 'netstd' instead.", language.c_str());
  }

  if (iter == the_map.end()) {
    return nullptr;
  }

  return iter->second->get_generator(program, parsed_options, options);
}